

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O0

ares_bool_t read_cmdline(int argc,char **argv,int start_idx)

{
  long *plVar1;
  ulong *puVar2;
  undefined2 *puVar3;
  bool bVar4;
  int iVar5;
  ares_bool_t aVar6;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  unsigned_short *s_1;
  size_t *s;
  char **str;
  ares_bool_t *b;
  char *ptr;
  size_t namelen;
  char *nameptr;
  char *value;
  ares_bool_t is_true;
  ares_bool_t option_handled;
  size_t opt;
  int arg;
  int start_idx_local;
  char **argv_local;
  int argc_local;
  
  opt._0_4_ = start_idx;
  do {
    if (argc <= (int)opt) {
      return ARES_TRUE;
    }
    bVar4 = false;
    _is_true = 0;
    while( true ) {
      bVar9 = false;
      if ((!bVar4) && (bVar9 = true, dig_options[_is_true].opt == (void *)0x0)) {
        bVar9 = dig_options[_is_true].cb != (dig_opt_cb_t)0x0;
      }
      if (!bVar9) break;
      nameptr = (char *)0x0;
      if ((dig_options[_is_true].prefix == '\0') ||
         (dig_options[_is_true].prefix == *argv[(int)opt])) {
        namelen = (size_t)argv[(int)opt];
        if (dig_options[_is_true].prefix != '\0') {
          namelen = namelen + 1;
        }
        iVar5 = ares_streq_max(namelen,"no",2);
        if (iVar5 != 0) {
          namelen = namelen + 2;
        }
        value._0_4_ = (ares_bool_t)(iVar5 == 0);
        if (dig_options[_is_true].separator == '\0') {
          ptr = (char *)ares_strlen(namelen);
        }
        else {
          pcVar7 = strchr((char *)namelen,(int)dig_options[_is_true].separator);
          if (pcVar7 == (char *)0x0) {
            ptr = (char *)ares_strlen(namelen);
          }
          else {
            ptr = pcVar7 + -namelen;
            nameptr = pcVar7 + 1;
          }
        }
        if ((dig_options[_is_true].name == (char *)0x0) ||
           (iVar5 = ares_streq_max(namelen,dig_options[_is_true].name,ptr), iVar5 != 0)) {
          if (dig_options[_is_true].name == (char *)0x0) {
            nameptr = (char *)namelen;
          }
          if (((dig_options[_is_true].type != OPT_TYPE_BOOL) &&
              (dig_options[_is_true].prefix != '\0')) && (dig_options[_is_true].separator == '\0'))
          {
            if ((int)opt == argc + -1) {
              snprintf(global_config.error,0x100,"insufficient arguments for %c%s",
                       (ulong)(uint)(int)dig_options[_is_true].prefix,dig_options[_is_true].name);
              return ARES_FALSE;
            }
            opt._0_4_ = (int)opt + 1;
            nameptr = argv[(int)opt];
          }
          switch(dig_options[_is_true].type) {
          case OPT_TYPE_BOOL:
            if ((ares_bool_t *)dig_options[_is_true].opt == (ares_bool_t *)0x0) {
              snprintf(global_config.error,0x100,"invalid use for %c%s",
                       (ulong)(uint)(int)dig_options[_is_true].prefix,dig_options[_is_true].name);
              return ARES_FALSE;
            }
            *(ares_bool_t *)dig_options[_is_true].opt = (ares_bool_t)value;
            break;
          case OPT_TYPE_STRING:
            plVar1 = (long *)dig_options[_is_true].opt;
            if (plVar1 == (long *)0x0) {
              snprintf(global_config.error,0x100,"invalid use for %c%s",
                       (ulong)(uint)(int)dig_options[_is_true].prefix,dig_options[_is_true].name);
              return ARES_FALSE;
            }
            if (nameptr == (char *)0x0) {
              snprintf(global_config.error,0x100,"missing value for %c%s",
                       (ulong)(uint)(int)dig_options[_is_true].prefix,dig_options[_is_true].name);
              return ARES_FALSE;
            }
            if (*plVar1 != 0) {
              free((void *)*plVar1);
            }
            pcVar7 = strdup(nameptr);
            *plVar1 = (long)pcVar7;
            break;
          case OPT_TYPE_SIZE_T:
            puVar2 = (ulong *)dig_options[_is_true].opt;
            if (puVar2 == (ulong *)0x0) {
              snprintf(global_config.error,0x100,"invalid use for %c%s",
                       (ulong)(uint)(int)dig_options[_is_true].prefix,dig_options[_is_true].name);
              return ARES_FALSE;
            }
            if (nameptr == (char *)0x0) {
              snprintf(global_config.error,0x100,"missing value for %c%s",
                       (ulong)(uint)(int)dig_options[_is_true].prefix,dig_options[_is_true].name);
              return ARES_FALSE;
            }
            iVar5 = ares_str_isnum(nameptr);
            if (iVar5 == 0) {
              snprintf(global_config.error,0x100,"%c%s is not a numeric value",
                       (ulong)(uint)(int)dig_options[_is_true].prefix,dig_options[_is_true].name);
              return ARES_FALSE;
            }
            uVar8 = strtoul(nameptr,(char **)0x0,10);
            *puVar2 = uVar8;
            break;
          case OPT_TYPE_U16:
            puVar3 = (undefined2 *)dig_options[_is_true].opt;
            if (puVar3 == (undefined2 *)0x0) {
              snprintf(global_config.error,0x100,"invalid use for %c%s",
                       (ulong)(uint)(int)dig_options[_is_true].prefix,dig_options[_is_true].name);
              return ARES_FALSE;
            }
            if (nameptr == (char *)0x0) {
              snprintf(global_config.error,0x100,"missing value for %c%s",
                       (ulong)(uint)(int)dig_options[_is_true].prefix,dig_options[_is_true].name);
              return ARES_FALSE;
            }
            iVar5 = ares_str_isnum(nameptr);
            if (iVar5 == 0) {
              snprintf(global_config.error,0x100,"%c%s is not a numeric value",
                       (ulong)(uint)(int)dig_options[_is_true].prefix,dig_options[_is_true].name);
              return ARES_FALSE;
            }
            uVar8 = strtoul(nameptr,(char **)0x0,10);
            *puVar3 = (short)uVar8;
            break;
          case OPT_TYPE_FUNC:
            if (dig_options[_is_true].cb == (dig_opt_cb_t)0x0) {
              snprintf(global_config.error,0x100,"missing callback");
              return ARES_FALSE;
            }
            aVar6 = (*dig_options[_is_true].cb)
                              (dig_options[_is_true].prefix,dig_options[_is_true].name,
                               (ares_bool_t)value,nameptr);
            if (aVar6 == ARES_FALSE) {
              return ARES_FALSE;
            }
          }
          bVar4 = true;
        }
      }
      _is_true = _is_true + 1;
    }
    if (!bVar4) {
      snprintf(global_config.error,0x100,"unrecognized option %s",argv[(int)opt]);
      return ARES_FALSE;
    }
    opt._0_4_ = (int)opt + 1;
  } while( true );
}

Assistant:

static ares_bool_t read_cmdline(int argc, const char * const *argv,
                                int start_idx)
{
  int    arg;
  size_t opt;

  for (arg = start_idx; arg < argc; arg++) {
    ares_bool_t option_handled = ARES_FALSE;

    for (opt = 0; !option_handled &&
                  (dig_options[opt].opt != NULL || dig_options[opt].cb != NULL);
         opt++) {
      ares_bool_t is_true = ARES_TRUE;
      const char *value   = NULL;
      const char *nameptr = NULL;
      size_t      namelen;

      /* Match prefix character */
      if (dig_options[opt].prefix != 0 &&
          dig_options[opt].prefix != *(argv[arg])) {
        continue;
      }

      nameptr = argv[arg];

      /* skip prefix */
      if (dig_options[opt].prefix != 0) {
        nameptr++;
      }

      /* Negated option if it has a 'no' prefix */
      if (ares_streq_max(nameptr, "no", 2)) {
        is_true  = ARES_FALSE;
        nameptr += 2;
      }

      if (dig_options[opt].separator != 0) {
        const char *ptr = strchr(nameptr, dig_options[opt].separator);
        if (ptr == NULL) {
          namelen = ares_strlen(nameptr);
        } else {
          namelen = (size_t)(ptr - nameptr);
          value   = ptr + 1;
        }
      } else {
        namelen = ares_strlen(nameptr);
      }

      /* Match name */
      if (dig_options[opt].name != NULL &&
          !ares_streq_max(nameptr, dig_options[opt].name, namelen)) {
        continue;
      }

      if (dig_options[opt].name == NULL) {
        value = nameptr;
      }

      /* We need another argument for the value */
      if (dig_options[opt].type != OPT_TYPE_BOOL &&
          dig_options[opt].prefix != 0 && dig_options[opt].separator == 0) {
        if (arg == argc - 1) {
          snprintf(global_config.error, sizeof(global_config.error),
                   "insufficient arguments for %c%s", dig_options[opt].prefix,
                   dig_options[opt].name);
          return ARES_FALSE;
        }
        arg++;
        value = argv[arg];
      }

      switch (dig_options[opt].type) {
        case OPT_TYPE_BOOL:
          {
            ares_bool_t *b = dig_options[opt].opt;
            if (b == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            *b = is_true;
          }
          break;
        case OPT_TYPE_STRING:
          {
            char **str = dig_options[opt].opt;
            if (str == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (value == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "missing value for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (*str != NULL) {
              free(*str);
            }
            *str = strdup(value);
            break;
          }
        case OPT_TYPE_SIZE_T:
          {
            size_t *s = dig_options[opt].opt;
            if (s == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (value == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "missing value for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (!ares_str_isnum(value)) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "%c%s is not a numeric value", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            *s = strtoul(value, NULL, 10);
            break;
          }
        case OPT_TYPE_U16:
          {
            unsigned short *s = dig_options[opt].opt;
            if (s == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (value == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "missing value for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (!ares_str_isnum(value)) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "%c%s is not a numeric value", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            *s = (unsigned short)strtoul(value, NULL, 10);
            break;
          }
        case OPT_TYPE_FUNC:
          if (dig_options[opt].cb == NULL) {
            snprintf(global_config.error, sizeof(global_config.error),
                     "missing callback");
            return ARES_FALSE;
          }
          if (!dig_options[opt].cb(dig_options[opt].prefix,
                                   dig_options[opt].name, is_true, value)) {
            return ARES_FALSE;
          }
          break;
      }
      option_handled = ARES_TRUE;
    }

    if (!option_handled) {
      snprintf(global_config.error, sizeof(global_config.error),
               "unrecognized option %s", argv[arg]);
      return ARES_FALSE;
    }
  }

  return ARES_TRUE;
}